

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic_simplification.cpp
# Opt level: O1

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::ArithmeticSimplificationRule::Apply
          (ArithmeticSimplificationRule *this,LogicalOperator *op,
          vector<std::reference_wrapper<duckdb::Expression>,_true> *bindings,bool *changes_made,
          bool is_root)

{
  string *psVar1;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *this_00;
  Value *this_01;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  bool bVar3;
  int iVar4;
  reference pvVar5;
  BoundFunctionExpression *pBVar6;
  BoundConstantExpression *pBVar7;
  reference pvVar8;
  InternalException *this_02;
  size_type __n;
  LogicalType *this_03;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_128;
  Value local_120;
  LogicalType local_e0;
  LogicalType local_c8;
  _func_int **local_b0 [8];
  Value local_70;
  
  pvVar5 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[]
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,0);
  pBVar6 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                     (&pvVar5->_M_data->super_BaseExpression);
  pvVar5 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[]
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,1);
  pBVar7 = BaseExpression::Cast<duckdb::BoundConstantExpression>
                     (&pvVar5->_M_data->super_BaseExpression);
  this_00 = &pBVar6->children;
  pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](this_00,0);
  if (((LogicalType *)&(pBVar7->value).is_null)->id_ == '\x01') {
    LogicalType::LogicalType(&local_c8,&(pBVar6->super_Expression).return_type);
    Value::Value((Value *)local_b0,&local_c8);
    pBVar7 = (BoundConstantExpression *)operator_new(0x98);
    Value::Value(&local_120,(Value *)local_b0);
    BoundConstantExpression::BoundConstantExpression(pBVar7,&local_120);
    Value::~Value(&local_120);
    (this->super_Rule)._vptr_Rule = (_func_int **)pBVar7;
    Value::~Value((Value *)local_b0);
    this_03 = &local_c8;
LAB_00681b69:
    LogicalType::~LogicalType(this_03);
    return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>)this;
  }
  _Var2._M_head_impl =
       (pvVar8->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
       .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  this_01 = &pBVar7->value;
  psVar1 = &(pBVar6->function).super_BaseScalarFunction.super_SimpleFunction.super_Function.name;
  iVar4 = ::std::__cxx11::string::compare((char *)psVar1);
  if (iVar4 == 0) {
    local_120.type_._0_8_ = (undefined1 *)0x0;
    bVar3 = Value::operator==(this_01,(int64_t *)&local_120);
    if (!bVar3) goto LAB_00681da3;
LAB_00681ceb:
    __n = (size_type)((BoundConstantExpression *)_Var2._M_head_impl == pBVar7);
  }
  else {
    iVar4 = ::std::__cxx11::string::compare((char *)psVar1);
    if (iVar4 == 0) {
      if ((BoundConstantExpression *)_Var2._M_head_impl == pBVar7) {
LAB_00681da3:
        (this->super_Rule)._vptr_Rule = (_func_int **)0x0;
        return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
      }
      local_120.type_._0_8_ = (undefined1 *)0x0;
      bVar3 = Value::operator==(this_01,(int64_t *)&local_120);
      if (!bVar3) goto LAB_00681da3;
    }
    else {
      iVar4 = ::std::__cxx11::string::compare((char *)psVar1);
      if (iVar4 == 0) {
        local_120.type_._0_8_ = &DAT_00000001;
        bVar3 = Value::operator==(this_01,(int64_t *)&local_120);
        if (!bVar3) {
          local_120.type_.id_ = INVALID;
          local_120.type_.physical_type_ = ~INVALID;
          local_120.type_._2_6_ = 0;
          bVar3 = Value::operator==(this_01,(int64_t *)&local_120);
          if (bVar3) {
            pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                     ::operator[](this_00,(ulong)((BoundConstantExpression *)_Var2._M_head_impl ==
                                                 pBVar7));
            local_128._M_head_impl =
                 (pvVar8->
                 super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
                 _M_t.
                 super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                 .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
            (pvVar8->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
            ._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
            Value::Numeric(&local_70,&(pBVar6->super_Expression).return_type,0);
            ExpressionRewriter::ConstantOrNull
                      ((ExpressionRewriter *)this,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)&local_128,&local_70);
            Value::~Value(&local_70);
            if (local_128._M_head_impl == (Expression *)0x0) {
              return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>)
                     this;
            }
            (*((local_128._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
            return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>)
                   this;
          }
          goto LAB_00681da3;
        }
        goto LAB_00681ceb;
      }
      iVar4 = ::std::__cxx11::string::compare((char *)psVar1);
      if (iVar4 != 0) {
        this_02 = (InternalException *)__cxa_allocate_exception(0x10);
        local_120.type_._0_8_ =
             &local_120.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_120,"Unrecognized function name in ArithmeticSimplificationRule"
                   ,"");
        InternalException::InternalException(this_02,(string *)&local_120);
        __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((BoundConstantExpression *)_Var2._M_head_impl == pBVar7) goto LAB_00681da3;
      local_120.type_._0_8_ = &DAT_00000001;
      bVar3 = Value::operator==(this_01,(int64_t *)&local_120);
      if (!bVar3) {
        local_120.type_.id_ = INVALID;
        local_120.type_.physical_type_ = ~INVALID;
        local_120.type_._2_6_ = 0;
        bVar3 = Value::operator==(this_01,(int64_t *)&local_120);
        if (bVar3) {
          LogicalType::LogicalType(&local_e0,&(pBVar6->super_Expression).return_type);
          Value::Value(&local_120,&local_e0);
          make_uniq<duckdb::BoundConstantExpression,duckdb::Value>((duckdb *)local_b0,&local_120);
          (this->super_Rule)._vptr_Rule = local_b0[0];
          local_b0[0] = (_func_int **)0x0;
          Value::~Value(&local_120);
          this_03 = &local_e0;
          goto LAB_00681b69;
        }
        goto LAB_00681da3;
      }
    }
    __n = 0;
  }
  pvVar8 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](this_00,__n);
  (this->super_Rule)._vptr_Rule =
       (_func_int **)
       (pvVar8->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
       .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pvVar8->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>)this;
}

Assistant:

unique_ptr<Expression> ArithmeticSimplificationRule::Apply(LogicalOperator &op, vector<reference<Expression>> &bindings,
                                                           bool &changes_made, bool is_root) {
	auto &root = bindings[0].get().Cast<BoundFunctionExpression>();
	auto &constant = bindings[1].get().Cast<BoundConstantExpression>();
	idx_t constant_child = root.children[0].get() == &constant ? 0 : 1;
	D_ASSERT(root.children.size() == 2);
	(void)root;
	// any arithmetic operator involving NULL is always NULL
	if (constant.value.IsNull()) {
		return make_uniq<BoundConstantExpression>(Value(root.return_type));
	}
	auto &func_name = root.function.name;
	if (func_name == "+") {
		if (constant.value == 0) {
			// addition with 0
			// we can remove the entire operator and replace it with the non-constant child
			return std::move(root.children[1 - constant_child]);
		}
	} else if (func_name == "-") {
		if (constant_child == 1 && constant.value == 0) {
			// subtraction by 0
			// we can remove the entire operator and replace it with the non-constant child
			return std::move(root.children[1 - constant_child]);
		}
	} else if (func_name == "*") {
		if (constant.value == 1) {
			// multiply with 1, replace with non-constant child
			return std::move(root.children[1 - constant_child]);
		} else if (constant.value == 0) {
			// multiply by zero: replace with constant or null
			return ExpressionRewriter::ConstantOrNull(std::move(root.children[1 - constant_child]),
			                                          Value::Numeric(root.return_type, 0));
		}
	} else if (func_name == "//") {
		if (constant_child == 1) {
			if (constant.value == 1) {
				// divide by 1, replace with non-constant child
				return std::move(root.children[1 - constant_child]);
			} else if (constant.value == 0) {
				// divide by 0, replace with NULL
				return make_uniq<BoundConstantExpression>(Value(root.return_type));
			}
		}
	} else {
		throw InternalException("Unrecognized function name in ArithmeticSimplificationRule");
	}
	return nullptr;
}